

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O0

wostream * mjs::operator<<(wostream *os,regexp_flag f)

{
  wostream *pwVar1;
  regexp_flag in_EDX;
  wstring local_38;
  regexp_flag local_14;
  wostream *pwStack_10;
  regexp_flag f_local;
  wostream *os_local;
  
  local_14 = f;
  pwStack_10 = os;
  regexp_flags_to_string_abi_cxx11_(&local_38,(mjs *)(ulong)f,in_EDX);
  pwVar1 = std::operator<<(os,(wstring *)&local_38);
  std::__cxx11::wstring::~wstring((wstring *)&local_38);
  return pwVar1;
}

Assistant:

std::wostream& operator<<(std::wostream& os, regexp_flag f) {
    return os << regexp_flags_to_string(f);
}